

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

Bdc_Fun_t * Bdc_ManDecompose_rec(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  Bdc_Fun_t *pBVar1;
  int iVar2;
  Bdc_Type_t Type;
  abctime aVar3;
  Bdc_Fun_t *pBVar4;
  abctime aVar5;
  Bdc_Fun_t *pBVar6;
  Bdc_Isf_t IsfB;
  Bdc_Isf_t IsfL;
  
  iVar2 = Kit_TruthIsDisjoint(pIsf->puOn,pIsf->puOff,p->nVars);
  if (iVar2 == 0) {
    __assert_fail("Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/bdc/bdcDec.c"
                  ,0x2b3,"Bdc_Fun_t *Bdc_ManDecompose_rec(Bdc_Man_t *, Bdc_Isf_t *)");
  }
  if (p->pPars->fVerbose == 0) {
    aVar3 = 0;
  }
  else {
    aVar3 = Abc_Clock();
  }
  pBVar4 = Bdc_TableLookup(p,pIsf);
  if (p->pPars->fVerbose != 0) {
    aVar5 = Abc_Clock();
    p->timeCache = p->timeCache + (aVar5 - aVar3);
  }
  if (pBVar4 != (Bdc_Fun_t *)0x0) {
    return pBVar4;
  }
  if (p->pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
  }
  Type = Bdc_DecomposeStep(p,pIsf,&IsfL,&IsfB);
  if (p->pPars->fVerbose != 0) {
    aVar5 = Abc_Clock();
    p->timeCheck = p->timeCheck + (aVar5 - aVar3);
  }
  if (Type == BDC_TYPE_MUX) {
    if (p->pPars->fVerbose != 0) {
      aVar3 = Abc_Clock();
    }
    iVar2 = Bdc_DecomposeStepMux(p,pIsf,&IsfL,&IsfB);
    if (p->pPars->fVerbose != 0) {
      aVar5 = Abc_Clock();
      p->timeMuxes = p->timeMuxes + (aVar5 - aVar3);
    }
    p->numMuxes = p->numMuxes + 1;
    pBVar4 = Bdc_ManDecompose_rec(p,&IsfL);
    pBVar6 = Bdc_ManDecompose_rec(p,&IsfB);
    if (pBVar6 != (Bdc_Fun_t *)0x0 && pBVar4 != (Bdc_Fun_t *)0x0) {
      if (p->nNodes <= iVar2 + 1) {
        __assert_fail("Id < p->nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/bdc/bdcInt.h"
                      ,0x81,"Bdc_Fun_t *Bdc_FunWithId(Bdc_Man_t *, int)");
      }
      pBVar1 = p->pNodes;
      pBVar4 = Bdc_ManCreateGate(p,(Bdc_Fun_t *)((ulong)(pBVar1 + (iVar2 + 1)) ^ 1),pBVar4,
                                 BDC_TYPE_AND);
      pBVar6 = Bdc_ManCreateGate(p,pBVar1 + (iVar2 + 1),pBVar6,BDC_TYPE_AND);
      if (pBVar6 != (Bdc_Fun_t *)0x0 && pBVar4 != (Bdc_Fun_t *)0x0) {
        Type = BDC_TYPE_OR;
LAB_0045a1c9:
        pBVar4 = Bdc_ManCreateGate(p,pBVar4,pBVar6,Type);
        return pBVar4;
      }
    }
  }
  else {
    pBVar4 = Bdc_ManDecompose_rec(p,&IsfL);
    if (pBVar4 != (Bdc_Fun_t *)0x0) {
      iVar2 = Bdc_DecomposeUpdateRight(p,pIsf,&IsfL,&IsfB,pBVar4,Type);
      if (iVar2 != 0) {
        p->nNodesNew = p->nNodesNew + -1;
        return pBVar4;
      }
      Bdc_SuppMinimize(p,&IsfB);
      pBVar6 = Bdc_ManDecompose_rec(p,&IsfB);
      if (pBVar6 != (Bdc_Fun_t *)0x0) goto LAB_0045a1c9;
    }
  }
  return (Bdc_Fun_t *)0x0;
}

Assistant:

Bdc_Fun_t * Bdc_ManDecompose_rec( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
//    int static Counter = 0;
//    int LocalCounter = Counter++;
    Bdc_Type_t Type;
    Bdc_Fun_t * pFunc, * pFunc0, * pFunc1;
    Bdc_Isf_t IsfL, * pIsfL = &IsfL;
    Bdc_Isf_t IsfB, * pIsfR = &IsfB;
    int iVar;
    abctime clk = 0; // Suppress "might be used uninitialized"
/*
printf( "Init function (%d):\n", LocalCounter );
Extra_PrintBinary( stdout, pIsf->puOn, 1<<4 );printf("\n");
Extra_PrintBinary( stdout, pIsf->puOff, 1<<4 );printf("\n");
*/
    // check computed results
    assert( Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars) );
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    pFunc = Bdc_TableLookup( p, pIsf );
    if ( p->pPars->fVerbose )
        p->timeCache += Abc_Clock() - clk;
    if ( pFunc )
        return pFunc;
    // decide on the decomposition type
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    Type = Bdc_DecomposeStep( p, pIsf, pIsfL, pIsfR );
    if ( p->pPars->fVerbose )
        p->timeCheck += Abc_Clock() - clk;
    if ( Type == BDC_TYPE_MUX )
    {
        if ( p->pPars->fVerbose )
            clk = Abc_Clock();
        iVar = Bdc_DecomposeStepMux( p, pIsf, pIsfL, pIsfR );
        if ( p->pPars->fVerbose )
            p->timeMuxes += Abc_Clock() - clk;
        p->numMuxes++;
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc  = Bdc_FunWithId( p, iVar + 1 );
        pFunc0 = Bdc_ManCreateGate( p, Bdc_Not(pFunc), pFunc0, BDC_TYPE_AND );
        pFunc1 = Bdc_ManCreateGate( p, pFunc,  pFunc1, BDC_TYPE_AND );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, BDC_TYPE_OR );
    }
    else
    {
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        if ( pFunc0 == NULL )
            return NULL;
        // decompose the right branch
        if ( Bdc_DecomposeUpdateRight( p, pIsf, pIsfL, pIsfR, pFunc0, Type ) )
        {
            p->nNodesNew--;
            return pFunc0;
        }
        Bdc_SuppMinimize( p, pIsfR );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc1 == NULL )
            return NULL;
        // create new gate
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, Type );
    }
    return pFunc;
}